

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,true,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  uint64_t uVar4;
  long lVar5;
  uint64_t uVar6;
  long lVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  sel_t sVar12;
  ulong uVar13;
  int64_t *piVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar8;
    }
    if (count + 0x3f < 0x40) {
      iVar8 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar15 = 0;
      uVar16 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar9 = count;
          }
LAB_00ee8ea2:
          uVar10 = uVar16;
          if (uVar16 < uVar9) {
            psVar2 = sel->sel_vector;
            uVar4 = ldata->lower;
            lVar5 = ldata->upper;
            psVar3 = true_sel->sel_vector;
            piVar14 = &rdata[uVar16].upper;
            do {
              uVar13 = uVar16;
              if (psVar2 != (sel_t *)0x0) {
                uVar13 = (ulong)psVar2[uVar16];
              }
              uVar6 = ((hugeint_t *)(piVar14 + -1))->lower;
              lVar7 = *piVar14;
              psVar3[iVar8] = (sel_t)uVar13;
              iVar8 = iVar8 + (lVar7 != lVar5 || uVar6 != uVar4);
              uVar16 = uVar16 + 1;
              piVar14 = piVar14 + 2;
              uVar10 = uVar9;
            } while (uVar9 != uVar16);
          }
        }
        else {
          uVar13 = puVar1[uVar15];
          uVar9 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar9 = count;
          }
          uVar10 = uVar9;
          if (uVar13 != 0) {
            if (uVar13 == 0xffffffffffffffff) goto LAB_00ee8ea2;
            uVar10 = uVar16;
            if (uVar16 < uVar9) {
              psVar2 = sel->sel_vector;
              psVar3 = true_sel->sel_vector;
              piVar14 = &rdata[uVar16].upper;
              uVar11 = 0;
              do {
                if (psVar2 == (sel_t *)0x0) {
                  sVar12 = (int)uVar16 + (int)uVar11;
                }
                else {
                  sVar12 = psVar2[uVar16 + uVar11];
                }
                if ((uVar13 >> (uVar11 & 0x3f) & 1) == 0) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = (ulong)(ldata->upper != *piVar14 ||
                                  ldata->lower != ((hugeint_t *)(piVar14 + -1))->lower);
                }
                psVar3[iVar8] = sVar12;
                iVar8 = iVar8 + uVar10;
                uVar11 = uVar11 + 1;
                piVar14 = piVar14 + 2;
                uVar10 = uVar9;
              } while ((uVar16 - uVar9) + uVar11 != 0);
            }
          }
        }
        uVar15 = uVar15 + 1;
        uVar16 = uVar10;
      } while (uVar15 != count + 0x3f >> 6);
    }
  }
  else {
    iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}